

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCScene::commit(ISPCScene *this)

{
  undefined8 *in_RDI;
  ISPCGeometry *geometry;
  uint geomID;
  uint local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 3); local_c = local_c + 1) {
    rtcAttachGeometryByID
              (*in_RDI,*(undefined8 *)(*(long *)(in_RDI[1] + (ulong)local_c * 8) + 8),local_c);
  }
  rtcCommitScene(*in_RDI);
  return;
}

Assistant:

void ISPCScene::commit()
  {
    for (unsigned int geomID=0; geomID<numGeometries; geomID++)
    {
      ISPCGeometry* geometry = geometries[geomID];
      rtcAttachGeometryByID(scene,geometry->geometry,geomID);
    }

    rtcCommitScene(scene);
  }